

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCallArgument.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::FunctionCallArgument::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionCallArgument *this,int level)

{
  bool bVar1;
  type pbVar2;
  ulong uVar3;
  pointer pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string _name;
  int level_local;
  FunctionCallArgument *this_local;
  
  _name.field_2._12_4_ = level;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"<implicit>",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->name);
  if (bVar1) {
    pbVar2 = std::
             unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&this->name);
    std::__cxx11::string::operator=((string *)local_40,(string *)pbVar2);
  }
  uVar3 = (ulong)(int)_name.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,uVar3,'\t',&local_d9);
  std::operator+(&local_b8,&local_d8,"FunctionCallArgument: ");
  std::operator+(&local_98,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_78,&local_98," = ");
  pEVar4 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->(&this->value);
  (*(pEVar4->super_Statement).super_ASTElement._vptr_ASTElement[3])
            (&local_100,pEVar4,(ulong)(_name.field_2._12_4_ + 1));
  std::operator+(__return_storage_ptr__,&local_78,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::FunctionCallArgument::dump(int level) const {
    std::string _name {"<implicit>"};
    if (this->name) {
        _name = *(this->name);
    }
    return std::string(level, '\t')+ "FunctionCallArgument: "+_name + " = "+ this->value->dump(level+1);
}